

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

bool __thiscall llvm::FoldingSetNodeID::operator==(FoldingSetNodeID *this,FoldingSetNodeIDRef RHS)

{
  FoldingSetNodeIDRef RHS_00;
  bool bVar1;
  const_pointer D;
  size_t S;
  FoldingSetNodeIDRef local_30;
  FoldingSetNodeID *local_20;
  FoldingSetNodeID *this_local;
  FoldingSetNodeIDRef RHS_local;
  
  RHS_local.Data = (uint *)RHS.Size;
  this_local = (FoldingSetNodeID *)RHS.Data;
  local_20 = this;
  D = SmallVectorTemplateCommon<unsigned_int,_void>::data
                ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
  S = SmallVectorBase::size((SmallVectorBase *)this);
  FoldingSetNodeIDRef::FoldingSetNodeIDRef(&local_30,D,S);
  RHS_00.Size = (size_t)RHS_local.Data;
  RHS_00.Data = (uint *)this_local;
  bVar1 = FoldingSetNodeIDRef::operator==(&local_30,RHS_00);
  return bVar1;
}

Assistant:

bool FoldingSetNodeID::operator==(FoldingSetNodeIDRef RHS) const {
  return FoldingSetNodeIDRef(Bits.data(), Bits.size()) == RHS;
}